

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

String __thiscall
testing::PrintTestPartResultToString(testing *this,TestPartResult *test_part_result)

{
  int line;
  Type type;
  char *file;
  Message *pMVar1;
  size_t extraout_RDX;
  String SVar2;
  char *local_50;
  char *local_48 [3];
  String local_30;
  Message local_20;
  TestPartResult *local_18;
  TestPartResult *test_part_result_local;
  
  local_18 = test_part_result;
  test_part_result_local = (TestPartResult *)this;
  Message::Message(&local_20);
  file = TestPartResult::file_name(local_18);
  line = TestPartResult::line_number(local_18);
  internal::FormatFileLocation((internal *)&local_30,file,line);
  pMVar1 = Message::operator<<(&local_20,&local_30);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x207ad9);
  type = TestPartResult::type(local_18);
  local_48[0] = TestPartResultTypeToString(type);
  pMVar1 = Message::operator<<(pMVar1,local_48);
  local_50 = TestPartResult::message(local_18);
  Message::operator<<(pMVar1,&local_50);
  Message::GetString((Message *)this);
  internal::String::~String(&local_30);
  Message::~Message(&local_20);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)this;
  return SVar2;
}

Assistant:

static internal::String PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}